

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O3

Am_Value offset_from_part_procedure(Am_Object *self)

{
  long *plVar1;
  float fVar2;
  ushort uVar3;
  int iVar4;
  undefined4 extraout_var;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_01;
  anon_union_8_8_ea4c8939_for_value aVar6;
  Am_Slot_Key in_SI;
  double dVar7;
  Am_Value AVar8;
  Am_Object local_20;
  long *plVar5;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  iVar4 = (*Am_Object::cc->_vptr_Am_Constraint_Context[6])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  Am_Object::Get_Object(&local_20,in_SI,(ulong)*(ushort *)((long)plVar5 + 0xc));
  in_value = Am_Object::Get(&local_20,*(Am_Slot_Key *)((long)plVar5 + 0xe),0);
  Am_Value::operator=((Am_Value *)self,in_value);
  Am_Object::~Am_Object(&local_20);
  plVar1 = plVar5 + 1;
  *(int *)plVar1 = (int)*plVar1 + -1;
  aVar6 = extraout_RDX;
  if ((int)*plVar1 == 0) {
    (**(code **)(*plVar5 + 0x20))(plVar5);
    aVar6 = extraout_RDX_00;
  }
  iVar4 = (int)plVar5[2];
  fVar2 = *(float *)((long)plVar5 + 0x14);
  uVar3 = *(ushort *)&self->data;
  if (uVar3 - 2 < 2) {
    self[1].data = (Am_Object_Data *)((long)(fVar2 * (float)(long)self[1].data) + (long)iVar4);
  }
  else if (uVar3 == 5) {
    *(float *)&self[1].data = fVar2 * *(float *)&self[1].data + (float)iVar4;
  }
  else if (uVar3 == 0x8006) {
    dVar7 = Am_Value::operator_cast_to_double((Am_Value *)self);
    Am_Value::operator=((Am_Value *)self,dVar7 * (double)fVar2 + (double)iVar4);
    aVar6 = extraout_RDX_01;
  }
  AVar8.value.wrapper_value = aVar6.wrapper_value;
  AVar8._0_8_ = self;
  return AVar8;
}

Assistant:

static Am_Value
offset_from_part_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Offset_Store_Data *store =
      (Part_Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()
          ->Get_Data();
  value = self.Get_Object(store->part).Get(store->key);
  store->Release();
  modify_value(value, store->offset, store->multiplier);
  return value;
}